

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_stack_test.cpp
# Opt level: O2

void __thiscall value_stack_test_single_type_Test::TestBody(value_stack_test_single_type_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  stack s;
  
  s.m_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  s.m_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  s.m_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  mvm::value_stack<mvm::list::mplist<int>_>::push<int>(&s,(int *)&gtest_ar);
  local_48.ptr_._0_4_ = 1;
  local_40.data_._0_4_ = mvm::value_stack<mvm::list::mplist<int>_>::pop<int>(&s);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","s.template pop<int>()",(int *)&local_48,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/value_stack_test.cpp"
               ,0x1d,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&s);
  return;
}

Assistant:

TEST(value_stack_test, single_type) {
  using stack = value_stack<mplist<int>>;

  stack s;
  s.push(1);

  EXPECT_EQ(1, s.template pop<int>());
}